

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t b_00;
  int iVar7;
  long lVar8;
  int i;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  long lVar10;
  byte bVar11;
  char *pcVar12;
  byte bVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  m256v A;
  uint8_t a_3 [6];
  uint8_t b [6];
  uint8_t s [6];
  uint8_t a [30];
  uint8_t a_4 [6];
  undefined4 local_d4;
  m256v local_d0;
  int local_b8;
  short local_b4;
  ulong local_b0;
  uint8_t local_a4 [6];
  int local_9e;
  short local_9a;
  m256v local_98;
  undefined6 uStack_80;
  m256v local_48;
  
  while (iVar7 = getopt(argc,argv,"h"), iVar7 != -1) {
    if (iVar7 == 0x3f) {
      exit(1);
    }
    if (iVar7 == 0x68) {
      usage();
      exit(0);
    }
  }
  puts("Running: test_get_el_offs()");
  m256v_make(&local_d0,7,0xb,(uint8_t *)&local_98);
  local_b0 = 0;
  uVar17 = 0;
  lVar8 = 0;
  uVar9 = extraout_RDX;
  do {
    uVar15 = 0;
    bVar18 = false;
    do {
      lVar10 = CONCAT71(local_d0.rstride._1_7_,(undefined1)local_d0.rstride) * uVar17 + uVar15;
      if (lVar10 != lVar8) {
        fprintf(_stderr,"  m256v_get_el_offs(A, %d, %d) = %zu\n",uVar17 & 0xffffffff,
                uVar15 & 0xffffffff,lVar10);
        fprintf(_stderr,"  would have expected %zu.  A is %d rows x %d cols\n",lVar8,7,0xb);
        uVar9 = extraout_RDX_00;
        break;
      }
      lVar8 = lVar8 + 1;
      bVar18 = 9 < uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0xb);
    if (!bVar18) break;
    bVar18 = 5 < uVar17;
    uVar17 = uVar17 + 1;
    uVar9 = CONCAT71((int7)(uVar9 >> 8),bVar18);
    local_b0 = uVar9;
  } while (uVar17 != 7);
  uVar17 = local_b0;
  pcVar12 = "--> FAIL (test test_get_el_offs())";
  if ((local_b0 & 1) != 0) {
    pcVar12 = "--> pass";
  }
  uVar16 = (byte)~(byte)local_b0 & 1;
  puts(pcVar12);
  puts("Running: test_el_access()");
  local_98.e._0_6_ = 0x20604080302;
  local_98.e._6_2_ = 0x406;
  uStack_80 = 0x70203080303;
  local_98.n_row = 0x1040103;
  local_98.n_col = 0x6020905;
  local_98.rstride._0_6_ = 0x70908050305;
  local_98.rstride._6_2_ = 0x309;
  m256v_make(&local_d0,6,5,(uint8_t *)&local_98);
  lVar8 = CONCAT71(local_d0.rstride._1_7_,(undefined1)local_d0.rstride);
  uVar9 = 0;
  pcVar12 = "diag";
  pbVar14 = local_d0.e;
  do {
    bVar11 = *pbVar14;
    bVar13 = (&DAT_0010463e)[uVar9];
    if (bVar13 != bVar11) goto LAB_0010141e;
    uVar9 = uVar9 + 1;
    pbVar14 = pbVar14 + lVar8 + 1;
  } while (uVar9 != 5);
  uVar9 = 0;
  pcVar12 = "first_row";
  do {
    bVar11 = local_d0.e[uVar9];
    bVar13 = (&DAT_00104643)[uVar9];
    if (bVar13 != bVar11) goto LAB_0010141e;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 5);
  uVar9 = 0;
  pcVar12 = "first_col";
  pbVar14 = local_d0.e;
  do {
    bVar11 = *pbVar14;
    bVar13 = (&DAT_00104648)[uVar9];
    if (bVar13 != bVar11) goto LAB_0010141e;
    uVar9 = uVar9 + 1;
    pbVar14 = pbVar14 + lVar8;
  } while (uVar9 != 6);
  pbVar14 = local_d0.e + 3;
  uVar9 = 0;
  pcVar12 = "col3";
  do {
    bVar11 = *pbVar14;
    bVar13 = (&DAT_0010464e)[uVar9];
    if (bVar13 != bVar11) goto LAB_0010141e;
    uVar9 = uVar9 + 1;
    pbVar14 = pbVar14 + lVar8;
  } while (uVar9 != 6);
  pcVar12 = "dzigzag";
  uVar15 = 0;
  do {
    uVar9 = uVar15;
    if (uVar9 == 10) {
      local_d0.e[lVar8 * 2 + 1] = 0x7b;
      uVar9 = 0;
      pcVar12 = "m_row2";
      goto LAB_0010147d;
    }
    bVar11 = local_d0.e[(uVar9 >> 1 & 0x7fffffff) + (uVar9 + 1 >> 1 & 0x7fffffff) * lVar8];
    bVar13 = (&DAT_00104654)[uVar9];
    uVar15 = uVar9 + 1;
  } while (bVar13 == bVar11);
LAB_0010141e:
  fprintf(_stderr,"Error in pattern `%s\', index %d:  Got %d, expected %d.\n",pcVar12,uVar9,
          (ulong)bVar11,(ulong)bVar13);
  puts("--> FAIL (test test_el_access())");
  uVar16 = 2 - ((uint)uVar17 & 1);
  goto LAB_0010149f;
  while (uVar9 = uVar9 + 1, uVar9 != 5) {
LAB_0010147d:
    bVar11 = local_d0.e[uVar9 + CONCAT71(local_d0.rstride._1_7_,(undefined1)local_d0.rstride) * 2];
    bVar13 = (&DAT_0010465e)[uVar9];
    if (bVar13 != bVar11) goto LAB_0010141e;
  }
  puts("--> pass");
LAB_0010149f:
  puts("Running: test_swap_rows()");
  local_d0._0_6_ = 0x60500000000;
  local_d0.n_row = 0x4030201;
  m256v_make(&local_98,3,2,(uint8_t *)&local_d0);
  m256v_swap_rows(&local_98,1,2);
  if ((short)local_d0.n_col == 0x403 && local_d0.n_row == 0x6050201) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row swap result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x65);
    puts("--> FAIL (test test_swap_rows())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_clear_row()");
  local_d0._0_6_ = 0x60500000000;
  local_d0.n_row = 0x4030201;
  m256v_make(&local_98,3,2,(uint8_t *)&local_d0);
  m256v_clear_row(&local_98,1);
  if ((short)local_d0.n_col == 0x605 && local_d0.n_row == 0x201) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row clear result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x79);
    puts("--> FAIL (test test_clear_row())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_multadd_row()");
  local_d0._0_6_ = 0xa0968c82786e;
  m256v_make(&local_98,3,2,(uint8_t *)&local_d0);
  m256v_multadd_row(&local_98,1,'\r',&local_98,2);
  if ((short)local_d0.n_col == 0x3242 && local_d0.n_row == -0x737d8792) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mult-add row result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x8d);
    puts("--> FAIL (test test_multadd_row())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_iszero()");
  local_d0.rstride._0_1_ = 0;
  local_d0.n_row = 0;
  local_d0.n_col = 0;
  m256v_make(&local_98,3,3,(uint8_t *)&local_d0);
  iVar7 = m256v_iszero(&local_98);
  if (iVar7 != 0) {
    *(undefined1 *)
     (CONCAT26(local_98.e._6_2_,local_98.e._0_6_) + 1 +
     CONCAT26(local_98.rstride._6_2_,(undefined6)local_98.rstride)) = 1;
    iVar7 = m256v_iszero(&local_98);
    if (iVar7 == 0) {
      puts("--> pass");
      goto LAB_0010165f;
    }
  }
  puts("--> FAIL (test test_iszero())");
  uVar16 = uVar16 + 1;
LAB_0010165f:
  puts("Running: test_clear()");
  _Var1 = test_clear();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_clear())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_copy()");
  _Var1 = test_copy();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_copy())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_permute_rows()");
  _Var1 = test_permute_rows();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_rows())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_permute_cols()");
  _Var1 = test_permute_cols();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_cols())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_add()");
  local_b4 = 0x5e3d;
  local_b8 = 0xc593726;
  m256v_make(&local_98,3,2,(uint8_t *)&local_b8);
  builtin_memcpy(local_a4,"A.9V>\t",6);
  m256v_make(&local_d0,3,2,local_a4);
  m256v_make(&local_48,3,2,(uint8_t *)&local_9e);
  m256v_add(&local_98,&local_d0,&local_48);
  if (local_9a == 0x5703 && local_9e == 0x5a601967) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x12e);
    puts("--> FAIL (test test_add())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_add_inplace()");
  local_48.n_col._0_2_ = 0x5e3d;
  local_48.n_row = 0xc593726;
  m256v_make(&local_98,3,2,(uint8_t *)&local_48);
  local_b4 = 0x93e;
  local_b8 = 0x56392e41;
  m256v_make(&local_d0,3,2,(uint8_t *)&local_b8);
  m256v_add_inplace(&local_98,&local_d0);
  if (local_b4 == 0x5703 && local_b8 == 0x5a601967) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x142);
    puts("--> FAIL (test test_add_inplace())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_mul0()");
  local_b4 = 0x5e3d;
  local_b8 = 0xc593726;
  m256v_make(&local_98,2,3,(uint8_t *)&local_b8);
  builtin_memcpy(local_a4,"A.9V>\t",6);
  m256v_make(&local_d0,3,2,local_a4);
  m256v_make(&local_48,2,2,(uint8_t *)&local_9e);
  m256v_mul(&local_98,&local_d0,&local_48);
  uVar2 = gf256_mul('&','A');
  uVar3 = gf256_mul('7','9');
  uVar4 = gf256_mul('Y','>');
  uVar3 = gf256_add(uVar3,uVar4);
  uVar2 = gf256_add(uVar2,uVar3);
  uVar3 = gf256_mul('&','.');
  uVar4 = gf256_mul('7','V');
  uVar5 = gf256_mul('Y','\t');
  uVar4 = gf256_add(uVar4,uVar5);
  uVar3 = gf256_add(uVar3,uVar4);
  uVar4 = gf256_mul('\f','A');
  uVar5 = gf256_mul('=','9');
  uVar6 = gf256_mul('^','>');
  uVar5 = gf256_add(uVar5,uVar6);
  uVar4 = gf256_add(uVar4,uVar5);
  uVar5 = gf256_mul('\f','.');
  uVar6 = gf256_mul('=','V');
  b_00 = gf256_mul('^','\t');
  uVar6 = gf256_add(uVar6,b_00);
  uVar5 = gf256_add(uVar5,uVar6);
  local_d4 = CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(uVar3,uVar2)));
  if (local_9e == local_d4) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mul result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x160);
    puts("--> FAIL (test test_mul0())");
    uVar16 = uVar16 + 1;
  }
  puts("Running: test_mul()");
  _Var1 = test_mul();
  if (_Var1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_mul())");
    uVar16 = uVar16 + 1;
  }
  return (uint)(uVar16 != 0);
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_get_el_offs());
	RUN_TEST(test_el_access());
	RUN_TEST(test_swap_rows());
	RUN_TEST(test_clear_row());
	RUN_TEST(test_multadd_row());

	// Tests for the entire matrix
	RUN_TEST(test_iszero());
	RUN_TEST(test_clear());
	RUN_TEST(test_copy());
	RUN_TEST(test_permute_rows());
	RUN_TEST(test_permute_cols());
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul0());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}